

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

KeyInfo * sqlite3KeyInfoFromExprList(Parse *pParse,ExprList *pList,int iStart,int nExtra)

{
  int iVar1;
  KeyInfo *pKVar2;
  CollSeq *pCVar3;
  long lVar4;
  ExprList_item *pEVar5;
  
  iVar1 = pList->nExpr;
  pKVar2 = sqlite3KeyInfoAlloc(pParse->db,iVar1 - iStart,nExtra + 1);
  if (pKVar2 != (KeyInfo *)0x0) {
    pEVar5 = pList->a + (uint)iStart;
    for (lVar4 = 0; iStart + lVar4 < (long)iVar1; lVar4 = lVar4 + 1) {
      pCVar3 = sqlite3ExprNNCollSeq(pParse,pEVar5->pExpr);
      pKVar2->aColl[lVar4] = pCVar3;
      pKVar2->aSortFlags[lVar4] = (pEVar5->fg).sortFlags;
      pEVar5 = pEVar5 + 1;
    }
  }
  return pKVar2;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoFromExprList(
  Parse *pParse,       /* Parsing context */
  ExprList *pList,     /* Form the KeyInfo object from this ExprList */
  int iStart,          /* Begin with this column of pList */
  int nExtra           /* Add this many extra columns to the end */
){
  int nExpr;
  KeyInfo *pInfo;
  struct ExprList_item *pItem;
  sqlite3 *db = pParse->db;
  int i;

  nExpr = pList->nExpr;
  pInfo = sqlite3KeyInfoAlloc(db, nExpr-iStart, nExtra+1);
  if( pInfo ){
    assert( sqlite3KeyInfoIsWriteable(pInfo) );
    for(i=iStart, pItem=pList->a+iStart; i<nExpr; i++, pItem++){
      pInfo->aColl[i-iStart] = sqlite3ExprNNCollSeq(pParse, pItem->pExpr);
      pInfo->aSortFlags[i-iStart] = pItem->fg.sortFlags;
    }
  }
  return pInfo;
}